

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleLeave(void *userData,wl_keyboard *keyboard,uint32_t serial,wl_surface *surface)

{
  uint32_t in_EDX;
  itimerspec timer;
  _GLFWwindow *window;
  undefined1 auStackY_48 [4];
  GLFWbool in_stack_ffffffffffffffbc;
  _GLFWwindow *in_stack_ffffffffffffffc0;
  
  if (_glfw.wl.keyboardFocus != (_GLFWwindow *)0x0) {
    memset(auStackY_48,0,0x20);
    timerfd_settime(_glfw.wl.keyRepeatTimerfd,0,(itimerspec *)auStackY_48,(itimerspec *)0x0);
    _glfw.wl.keyboardFocus = (_GLFWwindow *)0x0;
    _glfw.wl.serial = in_EDX;
    _glfwInputWindowFocus(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static void keyboardHandleLeave(void* userData,
                                struct wl_keyboard* keyboard,
                                uint32_t serial,
                                struct wl_surface* surface)
{
    _GLFWwindow* window = _glfw.wl.keyboardFocus;

    if (!window)
        return;

    struct itimerspec timer = {0};
    timerfd_settime(_glfw.wl.keyRepeatTimerfd, 0, &timer, NULL);

    _glfw.wl.serial = serial;
    _glfw.wl.keyboardFocus = NULL;
    _glfwInputWindowFocus(window, GLFW_FALSE);
}